

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int lut_nmsedec_ref0 [128];
  int lut_nmsedec_ref [128];
  int lut_nmsedec_sig0 [128];
  int lut_nmsedec_sig [128];
  int lut_ctxno_zc [1024];
  int local_1828 [128];
  int local_1628 [128];
  int local_1428 [128];
  uint local_1228 [128];
  uint local_1028 [1023];
  uint local_2c;
  
  puts("/* This file was automatically generated by t1_generate_luts.c */\n");
  uVar1 = 0;
  do {
    uVar9 = uVar1 << 8;
    if (uVar1 == 1) {
      uVar9 = 0x200;
    }
    uVar5 = (ulong)uVar9;
    if (uVar1 == 2) {
      uVar5 = 0x100;
    }
    uVar6 = 0;
    do {
      uVar9 = (uint)uVar6;
      iVar7 = ((uint)(uVar6 >> 7) & 0x1ffffff) + (uint)((uVar9 >> 5 & 1) != 0);
      iVar2 = ((uint)(uVar6 >> 4) & 1) + (uint)((uVar9 >> 6 & 1) != 0);
      iVar8 = ((uint)(uVar6 >> 1) & 1) + (uVar9 & 1) + (uint)((uVar9 >> 3 & 1) != 0) +
              (uint)((uVar9 >> 2 & 1) != 0);
      iVar3 = iVar7;
      if (uVar1 < 2) {
LAB_00101208:
        if (iVar3 == 1) {
          uVar9 = 7;
          if (iVar2 == 0) {
            iVar3 = 6;
            iVar7 = iVar8;
LAB_001012b4:
            uVar9 = iVar3 - (uint)(iVar7 == 0);
          }
        }
        else {
          uVar9 = 8;
          if (iVar3 == 0) {
            if (iVar2 == 1) {
              uVar9 = 3;
            }
            else if (iVar2 == 0) {
              uVar9 = (iVar8 != 1) + 1;
              if (iVar8 == 0) {
                uVar9 = 0;
              }
            }
            else {
              uVar9 = 4;
            }
          }
        }
      }
      else if (uVar1 == 3) {
        iVar7 = iVar7 + iVar2;
        if (iVar8 == 2) {
          iVar3 = 7;
          goto LAB_001012b4;
        }
        if (iVar8 == 1) {
          uVar9 = iVar7 == 1 ^ 5;
          if (iVar7 == 0) {
            uVar9 = 3;
          }
        }
        else {
          uVar9 = 8;
          if ((iVar8 == 0) && (uVar9 = (iVar7 != 1) + 1, iVar7 == 0)) {
            uVar9 = 0;
          }
        }
      }
      else {
        uVar9 = 0;
        iVar3 = iVar2;
        iVar2 = iVar7;
        if (uVar1 == 2) goto LAB_00101208;
      }
      local_1228[uVar5 + uVar6 + 0x80] = uVar9;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
    uVar1 = uVar1 + 1;
    if (uVar1 == 4) {
      printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
      uVar5 = 1;
      do {
        printf("%i, ",(ulong)local_1228[uVar5 + 0x7f]);
        if ((uVar5 & 0x1f) == 0) {
          printf("\n  ");
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x400);
      printf("%i\n};\n\n",(ulong)local_2c);
      printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
      uVar1 = 1;
      iVar7 = 0;
      do {
        uVar9 = t1_init_ctxno_sc(iVar7);
        printf("0x%x, ",(ulong)uVar9);
        if ((uVar1 & 0xf) == 0) {
          printf("\n  ");
        }
        uVar1 = uVar1 + 1;
        iVar7 = iVar7 + 0x10;
      } while (uVar1 != 0x100);
      printf("0x%x\n};\n\n",0xd);
      printf("static OPJ_BYTE lut_spb[256] = {\n  ");
      uVar1 = 1;
      iVar7 = 0;
      do {
        uVar9 = t1_init_spb(iVar7);
        printf("%i, ",(ulong)uVar9);
        if ((uVar1 & 0x1f) == 0) {
          printf("\n  ");
        }
        uVar1 = uVar1 + 1;
        iVar7 = iVar7 + 0x10;
      } while (uVar1 != 0x100);
      uVar4 = 1;
      printf("%i\n};\n\n");
      uVar5 = 0;
      do {
        dVar12 = (double)(int)uVar5 * 0.015625;
        dVar11 = dVar12 + -1.5;
        dVar10 = floor((dVar12 * dVar12 - dVar11 * dVar11) * 64.0 + 0.5);
        uVar1 = (uint)(dVar10 * 0.015625 * 8192.0);
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        local_1228[uVar5] = uVar1;
        dVar10 = floor(dVar12 * dVar12 * 64.0 + 0.5);
        iVar7 = (int)(dVar10 * 0.015625 * 8192.0);
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        local_1428[uVar5] = iVar7;
        dVar10 = dVar12 + -0.5;
        if (0x3f < uVar5) {
          dVar10 = dVar11;
        }
        dVar11 = (dVar12 + -1.0) * (dVar12 + -1.0);
        dVar10 = floor((dVar11 - dVar10 * dVar10) * 64.0 + 0.5);
        iVar7 = (int)(dVar10 * 0.015625 * 8192.0);
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        local_1628[uVar5] = iVar7;
        dVar10 = floor(dVar11 * 64.0 + 0.5);
        iVar3 = (int)uVar4;
        iVar7 = (int)(dVar10 * 0.015625 * 8192.0);
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        local_1828[uVar5] = iVar7;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x80);
      printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
      dump_array16((int *)local_1228,iVar3);
      printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
      dump_array16(local_1428,iVar3);
      printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
      dump_array16(local_1628,iVar3);
      printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
      dump_array16(local_1828,iVar3);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int i, j;
	double u, v, t;

	int lut_ctxno_zc[1024];
	int lut_nmsedec_sig[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS];
  (void)argc; (void)argv;

	printf("/* This file was automatically generated by t1_generate_luts.c */\n\n");

	/* lut_ctxno_zc */
	for (j = 0; j < 4; ++j) {
		for (i = 0; i < 256; ++i) {
			int orient = j;
			if (orient == 2) {
				orient = 1;
			} else if (orient == 1) {
				orient = 2;
			}
			lut_ctxno_zc[(orient << 8) | i] = t1_init_ctxno_zc(i, j);
		}
	}

	printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
	for (i = 0; i < 1023; ++i) {
		printf("%i, ", lut_ctxno_zc[i]);
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", lut_ctxno_zc[1023]);

	/* lut_ctxno_sc */
	printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("0x%x, ", t1_init_ctxno_sc(i << 4));
		if(!((i+1)&0xf))
			printf("\n  ");
	}
	printf("0x%x\n};\n\n", t1_init_ctxno_sc(255 << 4));

	/* lut_spb */
	printf("static OPJ_BYTE lut_spb[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("%i, ", t1_init_spb(i << 4));
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", t1_init_spb(255 << 4));

	/* FIXME FIXME FIXME */
	/* fprintf(stdout,"nmsedec luts:\n"); */
	for (i = 0; i < (1 << T1_NMSEDEC_BITS); ++i) {
		t = i / pow(2, T1_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		lut_nmsedec_sig[i] = 
			opj_int_max(0, 
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_sig0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		u = t - 1.0;
		if (i & (1 << (T1_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		lut_nmsedec_ref[i] =
			opj_int_max(0,
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_ref0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
	}

	printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig0, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref0, 1 << T1_NMSEDEC_BITS);

	return 0;
}